

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo_cpplint.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 uVar2;
  char *__s1;
  long lVar3;
  
  uVar2 = 0;
  for (lVar3 = 1; lVar3 < argc; lVar3 = lVar3 + 1) {
    __s1 = argv[lVar3];
    iVar1 = strcmp(__s1,"--error");
    if (iVar1 == 0) {
      uVar2 = 1;
    }
    if (*__s1 != '-') {
      if ((int)uVar2 != 0) {
        fprintf(_stderr,"%s:0:  message  [category/category] [0]\n",__s1);
        __s1 = argv[lVar3];
      }
      fprintf(_stdout,"Done processing %s\nTotal errors found: %i\n",__s1,uVar2);
    }
  }
  return (int)uVar2;
}

Assistant:

int main(int argc, char* argv[])
{
  int error = 0;
  int i;
  for (i = 1; i < argc; ++i) {
    if (strcmp(argv[i], "--error") == 0) {
      error = 1;
    }
    if (argv[i][0] != '-') {
      if (error) {
        fprintf(stderr, "%s:0:  message  [category/category] [0]\n", argv[i]);
      }
      fprintf(stdout, "Done processing %s\nTotal errors found: %i\n", argv[i],
              error);
    }
  }
  return error;
}